

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  uchar filterType;
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong bytewidth;
  uchar *scanline;
  void *pvVar4;
  uchar *puVar5;
  long lVar6;
  ulong uVar7;
  LodePNGFilterStrategy LVar8;
  ulong uVar9;
  ulong length;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uchar *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float result;
  float fVar23;
  uchar *local_4e8;
  uchar *local_4e0;
  uchar *local_4d8;
  uchar *local_4d0;
  uchar *dummy;
  size_t size [5];
  uchar *attempt [5];
  uint count [256];
  
  uVar12 = (ulong)h;
  uVar3 = lodepng_get_bpp(info);
  LVar8 = settings->filter_strategy;
  if ((settings->filter_palette_zero != 0) &&
     ((info->colortype == LCT_PALETTE || (info->bitdepth < 8)))) {
    LVar8 = LFS_ZERO;
  }
  if (uVar3 == 0) {
    uVar3 = 0x1f;
  }
  else if (LVar8 < (LFS_PREDEFINED|LFS_MINSUM)) {
    length = (ulong)(w * uVar3 + 7 >> 3);
    bytewidth = (ulong)(uVar3 + 7 >> 3);
    switch(LVar8) {
    case LFS_ZERO:
      uVar12 = (ulong)h;
      puVar14 = out + 1;
      uVar3 = 0;
      puVar5 = (uchar *)0x0;
      while (scanline = in, bVar18 = uVar12 != 0, uVar12 = uVar12 - 1, bVar18) {
        puVar14[-1] = '\0';
        filterScanline(puVar14,scanline,puVar5,length,bytewidth,'\0');
        puVar14 = puVar14 + length + 1;
        in = scanline + length;
        puVar5 = scanline;
      }
      break;
    case LFS_MINSUM:
      lVar15 = 0;
      do {
        if (lVar15 == 5) {
          puVar5 = out + 1;
          uVar11 = 0;
          uVar10 = 0;
          local_4e0 = (uchar *)0x0;
          for (uVar17 = 0; uVar17 != uVar12; uVar17 = uVar17 + 1) {
            lVar15 = uVar17 * length;
            for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
              puVar14 = *(uchar **)(count + uVar13 * 2);
              filterScanline(puVar14,in + lVar15,local_4e0,length,bytewidth,(uchar)uVar13);
              uVar7 = 0;
              uVar9 = 0;
              if (uVar13 == 0) {
                for (; length != uVar9; uVar9 = uVar9 + 1) {
                  uVar7 = uVar7 + puVar14[uVar9];
                }
              }
              else {
                for (; length != uVar9; uVar9 = uVar9 + 1) {
                  bVar1 = puVar14[uVar9];
                  uVar3 = bVar1 ^ 0xff;
                  if (-1 < (char)bVar1) {
                    uVar3 = (uint)bVar1;
                  }
                  uVar7 = uVar7 + uVar3;
                }
              }
              bVar18 = uVar7 < uVar11;
              if (bVar18 || uVar13 == 0) {
                uVar11 = uVar7;
              }
              if (bVar18 || uVar13 == 0) {
                uVar10 = uVar13 & 0xff;
              }
            }
            out[(length + 1) * uVar17] = (uchar)uVar10;
            for (uVar13 = 0; length != uVar13; uVar13 = uVar13 + 1) {
              puVar5[uVar13] = *(uchar *)(*(long *)(count + uVar10 * 2) + uVar13);
            }
            puVar5 = puVar5 + length + 1;
            local_4e0 = in + lVar15;
          }
          for (lVar15 = 0; lVar15 != 5; lVar15 = lVar15 + 1) {
            free(*(void **)(count + lVar15 * 2));
          }
          goto LAB_0010ef84;
        }
        pvVar4 = malloc(length);
        *(void **)(count + lVar15 * 2) = pvVar4;
        lVar15 = lVar15 + 1;
      } while (pvVar4 != (void *)0x0);
LAB_0010eaa3:
      uVar3 = 0x53;
      break;
    case LFS_ENTROPY:
      lVar15 = 0;
LAB_0010e9f6:
      if (lVar15 != 5) goto code_r0x0010ea00;
      lVar15 = length + 1;
      local_4d0 = out + 1;
      fVar19 = 0.0;
      uVar11 = 0;
      puVar5 = (uchar *)0x0;
      for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
        lVar16 = uVar10 * length;
        for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
          puVar14 = (uchar *)size[uVar17];
          filterScanline(puVar14,in + lVar16,puVar5,length,bytewidth,(uchar)uVar17);
          for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
            count[lVar6] = 0;
          }
          for (uVar13 = 0; length != uVar13; uVar13 = uVar13 + 1) {
            count[puVar14[uVar13]] = count[puVar14[uVar13]] + 1;
          }
          count[uVar17] = count[uVar17] + 1;
          fVar20 = 0.0;
          for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
            if (count[lVar6] == 0) {
              fVar21 = 0.0;
            }
            else {
              fVar21 = (float)count[lVar6] / (float)(int)lVar15;
              fVar23 = 0.0;
              for (fVar22 = 1.0 / fVar21; 32.0 < fVar22; fVar22 = fVar22 * 0.0625) {
                fVar23 = fVar23 + 4.0;
              }
              for (; 2.0 < fVar22; fVar22 = fVar22 * 0.5) {
                fVar23 = fVar23 + 1.0;
              }
              fVar21 = fVar21 * ((fVar22 * fVar22 * 3.0 * -0.5 + (fVar22 * fVar22 * fVar22) / 3.0 +
                                  fVar22 * 3.0 + -1.83333) * 1.442695 + fVar23);
            }
            fVar20 = fVar20 + fVar21;
          }
          if (fVar20 < fVar19 || uVar17 == 0) {
            uVar11 = uVar17 & 0xffffffff;
            fVar19 = fVar20;
          }
        }
        out[lVar15 * uVar10] = (uchar)uVar11;
        for (uVar17 = 0; length != uVar17; uVar17 = uVar17 + 1) {
          local_4d0[uVar17] = *(uchar *)(size[uVar11] + uVar17);
        }
        local_4d0 = local_4d0 + lVar15;
        puVar5 = in + lVar16;
      }
      for (lVar15 = 0; lVar15 != 5; lVar15 = lVar15 + 1) {
        free((void *)size[lVar15]);
      }
      goto LAB_0010ef84;
    case LFS_BRUTE_FORCE:
      uVar2 = (settings->zlibsettings).use_lz77;
      count[2] = (settings->zlibsettings).windowsize;
      count[3] = (settings->zlibsettings).minmatch;
      count._40_8_ = (settings->zlibsettings).custom_context;
      count[4] = (settings->zlibsettings).nicematch;
      count[5] = (settings->zlibsettings).lazymatching;
      count[1] = uVar2;
      count[0] = 1;
      count[6] = 0;
      count[7] = 0;
      count[8] = 0;
      count[9] = 0;
      lVar15 = 0;
LAB_0010ea5a:
      if (lVar15 != 5) goto code_r0x0010ea64;
      puVar5 = out + 1;
      local_4d8 = (uchar *)0x0;
      uVar10 = 0;
      uVar17 = 0;
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        lVar15 = uVar11 * length;
        lVar16 = 0;
        for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
          puVar14 = attempt[uVar13];
          filterScanline(puVar14,in + lVar15,local_4d8,length,bytewidth,(uchar)uVar13);
          size[uVar13] = 0;
          dummy = (uchar *)0x0;
          zlib_compress(&dummy,(size_t *)((long)size + lVar16),puVar14,length,
                        (LodePNGCompressSettings *)count);
          free(dummy);
          if (size[uVar13] < uVar10 || lVar16 == 0) {
            uVar17 = uVar13 & 0xffffffff;
            uVar10 = size[uVar13];
          }
          lVar16 = lVar16 + 8;
        }
        out[(length + 1) * uVar11] = (uchar)uVar17;
        for (uVar13 = 0; length != uVar13; uVar13 = uVar13 + 1) {
          puVar5[uVar13] = attempt[uVar17][uVar13];
        }
        puVar5 = puVar5 + length + 1;
        local_4d8 = in + lVar15;
      }
      for (lVar15 = 0; lVar15 != 5; lVar15 = lVar15 + 1) {
        free(attempt[lVar15]);
      }
      goto LAB_0010ef84;
    case LFS_PREDEFINED:
      local_4e8 = out + 1;
      puVar5 = (uchar *)0x0;
      for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        filterType = settings->predefined_filters[uVar10];
        local_4e8[-1] = filterType;
        filterScanline(local_4e8,in,puVar5,length,bytewidth,filterType);
        local_4e8 = local_4e8 + length + 1;
        puVar5 = in;
        in = in + length;
      }
LAB_0010ef84:
      uVar3 = 0;
    }
  }
  else {
    uVar3 = 0x58;
  }
  return uVar3;
code_r0x0010ea64:
  puVar5 = (uchar *)malloc(length);
  attempt[lVar15] = puVar5;
  lVar15 = lVar15 + 1;
  if (puVar5 == (uchar *)0x0) goto LAB_0010eaa3;
  goto LAB_0010ea5a;
code_r0x0010ea00:
  pvVar4 = malloc(length);
  size[lVar15] = (size_t)pvVar4;
  lVar15 = lVar15 + 1;
  if (pvVar4 == (void *)0x0) goto LAB_0010eaa3;
  goto LAB_0010e9f6;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}